

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::mvhd::parse(mvhd *this,char *ptr)

{
  uint32_t uVar1;
  char *ptr_local;
  mvhd *this_local;
  
  (this->super_full_box).super_box.field_0x62 = ptr[8];
  if ((this->super_full_box).super_box.field_0x62 == '\x01') {
    uVar1 = anon_unknown.dwarf_1232e::fmp4_read_uint32(ptr + 0x1c);
    this->time_scale_ = uVar1;
  }
  else {
    uVar1 = anon_unknown.dwarf_1232e::fmp4_read_uint32(ptr + 0x14);
    this->time_scale_ = uVar1;
  }
  return;
}

Assistant:

void mvhd::parse(char const *ptr)
	{
		this->version_ = (unsigned int)ptr[8];

		if (version_ == 1)
			this->time_scale_ = fmp4_read_uint32(ptr + 12 + 8 + 8);
		else
			this->time_scale_ = fmp4_read_uint32(ptr + 12 + 8);

		return;
	}